

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcparam.c
# Opt level: O0

void jpeg_set_defaults(j_compress_ptr cinfo)

{
  long lVar1;
  long *in_RDI;
  int i;
  boolean in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  int iVar2;
  
  if (*(int *)((long)in_RDI + 0x24) != 100) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  if (in_RDI[0xb] == 0) {
    lVar1 = (**(code **)in_RDI[1])(in_RDI,0,0x3c0);
    in_RDI[0xb] = lVar1;
  }
  *(undefined4 *)(in_RDI + 9) = 8;
  jpeg_set_quality((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  std_huff_tables((j_common_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  for (iVar2 = 0; iVar2 < 0x10; iVar2 = iVar2 + 1) {
    *(undefined1 *)((long)in_RDI + (long)iVar2 + 0xc0) = 0;
    *(undefined1 *)((long)in_RDI + (long)iVar2 + 0xd0) = 1;
    *(undefined1 *)((long)in_RDI + (long)iVar2 + 0xe0) = 5;
  }
  in_RDI[0x1f] = 0;
  *(undefined4 *)(in_RDI + 0x1e) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)((long)in_RDI + 0x104) = 0;
  *(undefined4 *)(in_RDI + 0x21) = 0;
  if (8 < (int)in_RDI[9]) {
    *(undefined4 *)(in_RDI + 0x21) = 1;
  }
  *(undefined4 *)((long)in_RDI + 0x10c) = 0;
  *(undefined4 *)(in_RDI + 0x22) = 0;
  *(undefined4 *)((long)in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x23) = 0;
  *(undefined4 *)((long)in_RDI + 0x11c) = 0;
  *(undefined1 *)((long)in_RDI + 0x124) = 1;
  *(undefined1 *)((long)in_RDI + 0x125) = 1;
  *(undefined1 *)((long)in_RDI + 0x126) = 0;
  *(undefined2 *)(in_RDI + 0x25) = 1;
  *(undefined2 *)((long)in_RDI + 0x12a) = 1;
  jpeg_default_colorspace((j_compress_ptr)CONCAT44(iVar2,in_stack_fffffffffffffff0));
  return;
}

Assistant:

GLOBAL(void)
jpeg_set_defaults(j_compress_ptr cinfo)
{
  int i;

  /* Safety check to ensure start_compress not called yet. */
  if (cinfo->global_state != CSTATE_START)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  /* Allocate comp_info array large enough for maximum component count.
   * Array is made permanent in case application wants to compress
   * multiple images at same param settings.
   */
  if (cinfo->comp_info == NULL)
    cinfo->comp_info = (jpeg_component_info *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_PERMANENT,
                                  MAX_COMPONENTS * sizeof(jpeg_component_info));

  /* Initialize everything not dependent on the color space */

#if JPEG_LIB_VERSION >= 70
  cinfo->scale_num = 1;         /* 1:1 scaling */
  cinfo->scale_denom = 1;
#endif
  cinfo->data_precision = BITS_IN_JSAMPLE;
  /* Set up two quantization tables using default quality of 75 */
  jpeg_set_quality(cinfo, 75, TRUE);
  /* Set up two Huffman tables */
  std_huff_tables((j_common_ptr)cinfo);

  /* Initialize default arithmetic coding conditioning */
  for (i = 0; i < NUM_ARITH_TBLS; i++) {
    cinfo->arith_dc_L[i] = 0;
    cinfo->arith_dc_U[i] = 1;
    cinfo->arith_ac_K[i] = 5;
  }

  /* Default is no multiple-scan output */
  cinfo->scan_info = NULL;
  cinfo->num_scans = 0;

  /* Expect normal source image, not raw downsampled data */
  cinfo->raw_data_in = FALSE;

  /* Use Huffman coding, not arithmetic coding, by default */
  cinfo->arith_code = FALSE;

  /* By default, don't do extra passes to optimize entropy coding */
  cinfo->optimize_coding = FALSE;
  /* The standard Huffman tables are only valid for 8-bit data precision.
   * If the precision is higher, force optimization on so that usable
   * tables will be computed.  This test can be removed if default tables
   * are supplied that are valid for the desired precision.
   */
  if (cinfo->data_precision > 8)
    cinfo->optimize_coding = TRUE;

  /* By default, use the simpler non-cosited sampling alignment */
  cinfo->CCIR601_sampling = FALSE;

#if JPEG_LIB_VERSION >= 70
  /* By default, apply fancy downsampling */
  cinfo->do_fancy_downsampling = TRUE;
#endif

  /* No input smoothing */
  cinfo->smoothing_factor = 0;

  /* DCT algorithm preference */
  cinfo->dct_method = JDCT_DEFAULT;

  /* No restart markers */
  cinfo->restart_interval = 0;
  cinfo->restart_in_rows = 0;

  /* Fill in default JFIF marker parameters.  Note that whether the marker
   * will actually be written is determined by jpeg_set_colorspace.
   *
   * By default, the library emits JFIF version code 1.01.
   * An application that wants to emit JFIF 1.02 extension markers should set
   * JFIF_minor_version to 2.  We could probably get away with just defaulting
   * to 1.02, but there may still be some decoders in use that will complain
   * about that; saying 1.01 should minimize compatibility problems.
   */
  cinfo->JFIF_major_version = 1; /* Default JFIF version = 1.01 */
  cinfo->JFIF_minor_version = 1;
  cinfo->density_unit = 0;      /* Pixel size is unknown by default */
  cinfo->X_density = 1;         /* Pixel aspect ratio is square by default */
  cinfo->Y_density = 1;

  /* Choose JPEG colorspace based on input space, set defaults accordingly */

  jpeg_default_colorspace(cinfo);
}